

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_19bb9b::SymlinkCommand::configureAttribute
          (SymlinkCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  bool bVar1;
  char *LHS;
  int *piVar2;
  size_t sVar3;
  string *this_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Child local_78;
  undefined8 uStack_70;
  Child local_68 [2];
  Child local_58;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  Child local_40;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  sVar3 = value.Length;
  piVar2 = (int *)value.Data;
  local_28.Length = name.Length;
  local_28.Data = name.Data;
  if (local_28.Length == 0x1d) {
    auVar6[0] = -(*(char *)((long)local_28.Data + 0xd) == 'n');
    auVar6[1] = -(*(char *)((long)local_28.Data + 0xe) == 'e');
    auVar6[2] = -(*(char *)((long)local_28.Data + 0xf) == 'r');
    auVar6[3] = -((char)*(long *)((long)local_28.Data + 0x10) == 's');
    auVar6[4] = -(*(char *)((long)local_28.Data + 0x11) == 'h');
    auVar6[5] = -(*(char *)((long)local_28.Data + 0x12) == 'i');
    auVar6[6] = -(*(char *)((long)local_28.Data + 0x13) == 'p');
    auVar6[7] = -(*(char *)((long)local_28.Data + 0x14) == '-');
    auVar6[8] = -(*(char *)((long)local_28.Data + 0x15) == 'a');
    auVar6[9] = -(*(char *)((long)local_28.Data + 0x16) == 'n');
    auVar6[10] = -(*(char *)((long)local_28.Data + 0x17) == 'a');
    auVar6[0xb] = -((char)*(long *)((long)local_28.Data + 0x18) == 'l');
    auVar6[0xc] = -(*(char *)((long)local_28.Data + 0x19) == 'y');
    auVar6[0xd] = -(*(char *)((long)local_28.Data + 0x1a) == 's');
    auVar6[0xe] = -(*(char *)((long)local_28.Data + 0x1b) == 'i');
    auVar6[0xf] = -(*(char *)((long)local_28.Data + 0x1c) == 's');
    auVar5[0] = -((char)*(long *)local_28.Data == 'r');
    auVar5[1] = -(*(char *)((long)local_28.Data + 1) == 'e');
    auVar5[2] = -(*(char *)((long)local_28.Data + 2) == 'p');
    auVar5[3] = -(*(char *)((long)local_28.Data + 3) == 'a');
    auVar5[4] = -(*(char *)((long)local_28.Data + 4) == 'i');
    auVar5[5] = -(*(char *)((long)local_28.Data + 5) == 'r');
    auVar5[6] = -(*(char *)((long)local_28.Data + 6) == '-');
    auVar5[7] = -(*(char *)((long)local_28.Data + 7) == 'v');
    auVar5[8] = -((char)*(long *)((long)local_28.Data + 8) == 'i');
    auVar5[9] = -(*(char *)((long)local_28.Data + 9) == 'a');
    auVar5[10] = -(*(char *)((long)local_28.Data + 10) == '-');
    auVar5[0xb] = -(*(char *)((long)local_28.Data + 0xb) == 'o');
    auVar5[0xc] = -(*(char *)((long)local_28.Data + 0xc) == 'w');
    auVar5[0xd] = -(*(char *)((long)local_28.Data + 0xd) == 'n');
    auVar5[0xe] = -(*(char *)((long)local_28.Data + 0xe) == 'e');
    auVar5[0xf] = -(*(char *)((long)local_28.Data + 0xf) == 'r');
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0014167d;
    if (sVar3 == 5) {
      if ((char)piVar2[1] != 'e' || *piVar2 != 0x736c6166) goto LAB_00141714;
      (this->super_Command).repairViaOwnershipAnalysis = false;
    }
    else {
      if ((sVar3 != 4) || (*piVar2 != 0x65757274)) {
LAB_00141714:
        LHS = "invalid value for attribute: \'";
        goto LAB_00141684;
      }
      (this->super_Command).repairViaOwnershipAnalysis = true;
    }
LAB_00141820:
    bVar1 = true;
  }
  else {
    if (local_28.Length == 0x10) {
      auVar4[0] = -((char)*(long *)local_28.Data == 'l');
      auVar4[1] = -(*(char *)((long)local_28.Data + 1) == 'i');
      auVar4[2] = -(*(char *)((long)local_28.Data + 2) == 'n');
      auVar4[3] = -(*(char *)((long)local_28.Data + 3) == 'k');
      auVar4[4] = -(*(char *)((long)local_28.Data + 4) == '-');
      auVar4[5] = -(*(char *)((long)local_28.Data + 5) == 'o');
      auVar4[6] = -(*(char *)((long)local_28.Data + 6) == 'u');
      auVar4[7] = -(*(char *)((long)local_28.Data + 7) == 't');
      auVar4[8] = -((char)*(long *)((long)local_28.Data + 8) == 'p');
      auVar4[9] = -(*(char *)((long)local_28.Data + 9) == 'u');
      auVar4[10] = -(*(char *)((long)local_28.Data + 10) == 't');
      auVar4[0xb] = -(*(char *)((long)local_28.Data + 0xb) == '-');
      auVar4[0xc] = -(*(char *)((long)local_28.Data + 0xc) == 'p');
      auVar4[0xd] = -(*(char *)((long)local_28.Data + 0xd) == 'a');
      auVar4[0xe] = -(*(char *)((long)local_28.Data + 0xe) == 't');
      auVar4[0xf] = -(*(char *)((long)local_28.Data + 0xf) == 'h');
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        local_78.twine = (Twine *)local_68;
        if (piVar2 == (int *)0x0) {
          uStack_70 = 0;
          local_68[0].twine = (Twine *)((ulong)(uint7)local_68[0]._1_7_ << 8);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,piVar2,sVar3 + (long)piVar2);
        }
        this_00 = (string *)&this->linkOutputPath;
        goto LAB_001417fd;
      }
    }
    else if ((local_28.Length == 8) && (*(long *)local_28.Data == 0x73746e65746e6f63)) {
      local_78.twine = (Twine *)local_68;
      if (piVar2 == (int *)0x0) {
        uStack_70 = 0;
        local_68[0].twine = (Twine *)((ulong)(uint7)local_68[0]._1_7_ << 8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,piVar2,sVar3 + (long)piVar2);
      }
      this_00 = (string *)&this->contents;
LAB_001417fd:
      std::__cxx11::string::operator=(this_00,(string *)&local_78.character);
      if (&(local_78.twine)->LHS != local_68) {
        operator_delete(local_78.twine,(ulong)((long)&(local_68[0].twine)->LHS + 1));
      }
      goto LAB_00141820;
    }
LAB_0014167d:
    LHS = "unexpected attribute: \'";
LAB_00141684:
    llvm::Twine::Twine((Twine *)&local_40,LHS,&local_28);
    llvm::Twine::Twine((Twine *)&local_58,"\'");
    if ((local_30 == NullKind) || (local_48 == NullKind)) {
      local_68[0].decUI._0_2_ = 0x100;
    }
    else if (local_30 == EmptyKind) {
      local_68[0].decUI._1_1_ = cStack_47;
      local_68[0].character = local_48;
      local_68[0]._2_6_ = uStack_46;
    }
    else if (local_48 == EmptyKind) {
      local_68[0].decUI._1_1_ = cStack_2f;
      local_68[0].character = local_30;
      local_68[0]._2_6_ = uStack_2e;
    }
    else {
      if (cStack_2f != '\x01') {
        local_30 = TwineKind;
        local_40.twine = (Twine *)&local_40;
      }
      if (cStack_47 != '\x01') {
        local_48 = TwineKind;
        local_58.twine = (Twine *)&local_58;
      }
      llvm::Twine::Twine((Twine *)&local_78,local_40,local_30,local_58,local_48);
    }
    llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_78);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "contents") {
      contents = value;
      return true;
    } else if (name == "link-output-path") {
      linkOutputPath = value;
      return true;
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }